

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool CreateSig(BaseSignatureCreator *creator,SignatureData *sigdata,SigningProvider *provider,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *sig_out,CPubKey *pubkey,
              CScript *scriptcode,SigVersion sigversion)

{
  long lVar1;
  char cVar2;
  int iVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_bool>
  pVar5;
  KeyOriginInfo info;
  undefined1 local_b8 [80];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  CKeyID keyid;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::GetID(&keyid,pubkey);
  iVar4 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::find(&(sigdata->signatures)._M_t,&keyid);
  if ((_Rb_tree_header *)iVar4._M_node == &(sigdata->signatures)._M_t._M_impl.super__Rb_tree_header)
  {
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = (*provider->_vptr_SigningProvider[7])(provider,&keyid,&info);
    if ((char)iVar3 != '\0') {
      memcpy((pair<CPubKey,_KeyOriginInfo> *)local_b8,pubkey,0x41);
      local_b8[0x48] = info.fingerprint[0];
      local_b8[0x49] = info.fingerprint[1];
      local_b8[0x4a] = info.fingerprint[2];
      local_b8[0x4b] = info.fingerprint[3];
      local_68._M_impl.super__Vector_impl_data._M_start =
           info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_68._M_impl.super__Vector_impl_data._M_finish =
           info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
           info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
      ::_M_emplace_unique<CKeyID&,std::pair<CPubKey,KeyOriginInfo>>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                  *)&sigdata->misc_pubkeys,&keyid,(pair<CPubKey,_KeyOriginInfo> *)local_b8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
    }
    iVar3 = (*creator->_vptr_BaseSignatureCreator[3])
                      (creator,provider,sig_out,&keyid,scriptcode,(ulong)sigversion);
    cVar2 = (char)iVar3;
    if (cVar2 == '\0') {
      std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back(&sigdata->missing_sigs,&keyid);
    }
    else {
      memcpy(local_b8,pubkey,0x41);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_b8 + 0x48),sig_out)
      ;
      pVar5 = std::
              _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::
              _M_emplace_unique<CKeyID&,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)&sigdata->signatures,&keyid,
                         (pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_b8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_b8 + 0x48));
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("i.second",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                      ,0x92,
                      "bool CreateSig(const BaseSignatureCreator &, SignatureData &, const SigningProvider &, std::vector<unsigned char> &, const CPubKey &, const CScript &, SigVersion)"
                     );
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (sig_out,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(iVar4._M_node + 4))
    ;
    cVar2 = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool CreateSig(const BaseSignatureCreator& creator, SignatureData& sigdata, const SigningProvider& provider, std::vector<unsigned char>& sig_out, const CPubKey& pubkey, const CScript& scriptcode, SigVersion sigversion)
{
    CKeyID keyid = pubkey.GetID();
    const auto it = sigdata.signatures.find(keyid);
    if (it != sigdata.signatures.end()) {
        sig_out = it->second.second;
        return true;
    }
    KeyOriginInfo info;
    if (provider.GetKeyOrigin(keyid, info)) {
        sigdata.misc_pubkeys.emplace(keyid, std::make_pair(pubkey, std::move(info)));
    }
    if (creator.CreateSig(provider, sig_out, keyid, scriptcode, sigversion)) {
        auto i = sigdata.signatures.emplace(keyid, SigPair(pubkey, sig_out));
        assert(i.second);
        return true;
    }
    // Could not make signature or signature not found, add keyid to missing
    sigdata.missing_sigs.push_back(keyid);
    return false;
}